

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupDfsNode(Gia_Man_t *p,Gia_Obj_t *pRoot)

{
  int iVar1;
  Gia_Man_t *pNew_00;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *pNew;
  Gia_Obj_t *pRoot_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsAnd(pRoot);
  if (iVar1 != 0) {
    Gia_ManFillValue(p);
    iVar1 = Gia_ManObjNum(p);
    pNew_00 = Gia_ManStart(iVar1);
    pcVar2 = Abc_UtilStrsav(p->pName);
    pNew_00->pName = pcVar2;
    pcVar2 = Abc_UtilStrsav(p->pSpec);
    pNew_00->pSpec = pcVar2;
    pGVar3 = Gia_ManConst0(p);
    pGVar3->Value = 0;
    Gia_ManDupDfs3_rec(pNew_00,p,pRoot);
    Gia_ManAppendCo(pNew_00,pRoot->Value);
    return pNew_00;
  }
  __assert_fail("Gia_ObjIsAnd(pRoot)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x815,"Gia_Man_t *Gia_ManDupDfsNode(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupDfsNode( Gia_Man_t * p, Gia_Obj_t * pRoot )
{
    Gia_Man_t * pNew;
    assert( Gia_ObjIsAnd(pRoot) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManDupDfs3_rec( pNew, p, pRoot );
    Gia_ManAppendCo( pNew, pRoot->Value );
    return pNew;
}